

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O3

void ac_trie_traverse_setfailure(ACT_NODE_t *node,AC_ALPHABET_t *prefix)

{
  ACT_NODE_t *pAVar1;
  ACT_NODE_t *nod;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  pAVar1 = node->trie->root;
  if (pAVar1 != node) {
    uVar4 = node->depth;
    if (1 < uVar4) {
      uVar3 = 1;
      uVar2 = 2;
      do {
        nod = pAVar1;
        bVar7 = pAVar1 != (ACT_NODE_t *)0x0;
        if ((pAVar1 != (ACT_NODE_t *)0x0) && (uVar5 = uVar2, uVar3 < uVar4)) {
          do {
            nod = node_find_next(nod,prefix[uVar5 - 1]);
            uVar4 = node->depth;
            bVar7 = nod != (ACT_NODE_t *)0x0;
            if (uVar4 <= uVar5) break;
            uVar5 = uVar5 + 1;
          } while (nod != (ACT_NODE_t *)0x0);
        }
        if (bVar7) {
          node->failure_node = nod;
          break;
        }
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar3 < uVar4);
    }
    if (node->failure_node == (act_node *)0x0) {
      node->failure_node = pAVar1;
    }
  }
  if (node->outgoing_size != 0) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      prefix[node->depth] = (&node->outgoing->alpha)[lVar6];
      ac_trie_traverse_setfailure(*(ACT_NODE_t **)((long)&node->outgoing->next + lVar6),prefix);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar4 < node->outgoing_size);
  }
  return;
}

Assistant:

static void ac_trie_traverse_setfailure 
    (ACT_NODE_t *node, AC_ALPHABET_t *prefix)
{
    size_t i;
    
    /* In each node, look for its failure node */
    ac_trie_set_failure (node, prefix);
    
    for (i = 0; i < node->outgoing_size; i++)
    {
        prefix[node->depth] = node->outgoing[i].alpha; /* Make the prefix */
        
        /* Recursively call itself to traverse all nodes */
        ac_trie_traverse_setfailure (node->outgoing[i].next, prefix);
    }
}